

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.c
# Opt level: O1

int load_shell(char *sh)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  int fd;
  char slavename [128];
  int local_8c;
  undefined1 local_88 [128];
  
  iVar1 = forkpty(&local_8c,local_88,0,0);
  if (iVar1 < 0) {
    local_8c = -1;
    if (((byte)loglevel & 1) != 0) {
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      syslog(3,"forkpty: %s\n",pcVar3);
    }
  }
  else if (iVar1 == 0) {
    execl(sh,"sh",0);
  }
  return local_8c;
}

Assistant:

int load_shell(const char *sh) 
{
    pid_t pid;
    int fd/*, oflags*/;
    //struct termios options;
    char slavename[128];
    if((pid = forkpty(&fd, slavename, NULL, NULL)) < 0) {
        LOGE("forkpty: %s\n", strerror(errno));
        return -1;
    } else if(pid == 0) {
        execl(sh, "sh", NULL);
    }
    /*
    // get the parameters
    tcgetattr(fd, &options);
    cfmakeraw(&options);

    tcsetattr(fd, TCSANOW, &options);

    oflags = fcntl(fd, F_GETFL);
    oflags |= (O_NONBLOCK | O_NOCTTY);
    fcntl(fd, F_SETFL, oflags);
    */

    return fd;
}